

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvlTree.h
# Opt level: O2

shared_ptr<AvlTree<int>::Node> __thiscall
AvlTree<int>::_insert(AvlTree<int> *this,shared_ptr<AvlTree<int>::Node> *node,int *key)

{
  int *piVar1;
  AvlTree<int> *this_00;
  int *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  int iVar3;
  int iVar4;
  __shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2> *this_01;
  shared_ptr<AvlTree<int>::Node> sVar5;
  __shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2> local_58;
  AvlTree<int> *local_48;
  long local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  piVar1 = *(int **)key;
  if (piVar1 == (int *)0x0) {
    sVar5 = std::make_shared<AvlTree<int>::Node,int&>((int *)this);
    _Var2 = sVar5.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    goto LAB_00102f55;
  }
  if (*in_RCX < *piVar1) {
    local_48 = (AvlTree<int> *)node;
    _insert((AvlTree<int> *)&local_58,node,piVar1 + 2);
    this_01 = (__shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)key + 8);
LAB_00102d95:
    std::__shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>::operator=(this_01,&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    std::__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<AvlTree<int>::Node,void>
              ((__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2> *)&local_58,
               (__shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)key + 8));
    iVar3 = 0;
    iVar4 = 0;
    if (local_58._M_ptr != (element_type *)0x0) {
      iVar4 = (local_58._M_ptr)->height;
    }
    std::__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<AvlTree<int>::Node,void>
              ((__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2> *)&local_40,
               (__shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)key + 0x18)
              );
    if (local_40 != 0) {
      iVar3 = *(int *)(local_40 + 0x28);
    }
    if (iVar3 < iVar4) {
      iVar3 = iVar4;
    }
    *(int *)(*(long *)key + 0x28) = iVar3 + 1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    std::__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<AvlTree<int>::Node,void>
              ((__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2> *)&local_58,
               (__shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)key + 8));
    this_00 = local_48;
    if (local_58._M_ptr == (element_type *)0x0) {
      iVar4 = 1;
    }
    else {
      iVar4 = (local_58._M_ptr)->size + 1;
    }
    std::__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<AvlTree<int>::Node,void>
              ((__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2> *)&local_40,
               (__shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)key + 0x18)
              );
    if (local_40 == 0) {
      iVar3 = 0;
    }
    else {
      iVar3 = *(int *)(local_40 + 0x2c);
    }
    *(int *)(*(long *)key + 0x2c) = iVar4 + iVar3;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    std::__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<AvlTree<int>::Node,void>
              ((__shared_ptr<AvlTree<int>::Node_const,(__gnu_cxx::_Lock_policy)2> *)&local_58,
               (__shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2> *)key);
    iVar4 = _getBalance(this_00,(shared_ptr<const_AvlTree<int>::Node> *)&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    if (1 < iVar4) {
      if (**(int **)(*(long *)key + 8) <= *in_RCX) {
        if (*in_RCX <= **(int **)(*(long *)key + 8)) goto LAB_00102f4a;
        _leftRotate((AvlTree<int> *)&local_58,&this_00->m_Root);
        std::__shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2> *)
                   (*(long *)key + 8),&local_58);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
      }
      sVar5 = _rightRotate(this,&this_00->m_Root);
      _Var2 = sVar5.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
      goto LAB_00102f55;
    }
    if (iVar4 < -1) {
      if (*in_RCX <= **(int **)(*(long *)key + 0x18)) {
        if (**(int **)(*(long *)key + 0x18) <= *in_RCX) goto LAB_00102f4a;
        _rightRotate((AvlTree<int> *)&local_58,&this_00->m_Root);
        std::__shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2> *)
                   (*(long *)key + 0x18),&local_58);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
      }
      sVar5 = _leftRotate(this,&this_00->m_Root);
      _Var2 = sVar5.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
      goto LAB_00102f55;
    }
  }
  else if (*piVar1 < *in_RCX) {
    local_48 = (AvlTree<int> *)node;
    _insert((AvlTree<int> *)&local_58,node,piVar1 + 6);
    this_01 = (__shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)key + 0x18);
    goto LAB_00102d95;
  }
LAB_00102f4a:
  std::__shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2> *)key);
  _Var2._M_pi = extraout_RDX;
LAB_00102f55:
  sVar5.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar5.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<AvlTree<int>::Node>)
         sVar5.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Node> _insert(std::shared_ptr<Node>& node, T& key) {
        if(node == nullptr)
            return Node::make_node(key);

        if(!(key < node->key) && !(node->key < key)) // key == node->key
            return node;

        if(key < node->key)
            node->left = _insert(node->left, key);
        else
            node->right = _insert(node->right, key);

        node->height = std::max(_height(node->left), _height(node->right)) + 1;
        node->size = _size(node->left) + _size(node->right) + 1;

        int balance = _getBalance(node);

        // Left Left Case
        if (balance > 1 && key < node->left->key)
            return _rightRotate(node);

        // Right Right Case
        if (balance < -1 && node->right->key < key) // key > node->right->key
            return _leftRotate(node);

        // Left Right Case
        if (balance > 1 && node->left->key < key) // key > node->left->key
        {
            node->left = _leftRotate(node->left);
            return _rightRotate(node);
        }

        // Right Left Case
        if (balance < -1 && key < node->right->key)
        {
            node->right = _rightRotate(node->right);
            return _leftRotate(node);
        }

        // Return the (unchanged) node pointer
        return node;
    }